

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGenerationObjects(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  bool bVar1;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  CreateLocalGenerators(this);
  bVar1 = GetConfigureDoneCMP0026(this);
  if (bVar1) {
    CheckTargetProperties(this);
  }
  CreateGeneratorTargets(this,targetTypes);
  if (targetTypes == AllTargets) {
    ComputeBuildFileGenerators(this);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGenerationObjects(TargetTypes targetTypes)
{
  this->CreateLocalGenerators();
  // Commit side effects only if we are actually generating
  if (this->GetConfigureDoneCMP0026()) {
    this->CheckTargetProperties();
  }
  this->CreateGeneratorTargets(targetTypes);
  if (targetTypes == TargetTypes::AllTargets) {
    this->ComputeBuildFileGenerators();
  }
}